

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O0

void __thiscall
QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
          (PromiseDataBase<void,_void_()> *this,function<void_()> *handler)

{
  QThread *local_58;
  pair<QPointer<QThread>,_std::function<void_()>_> local_50;
  QWriteLocker local_20;
  QWriteLocker lock;
  function<void_()> *handler_local;
  PromiseDataBase<void,_void_()> *this_local;
  
  lock.q_val = (quintptr)handler;
  QWriteLocker::QWriteLocker(&local_20,&this->m_lock);
  local_58 = (QThread *)QThread::currentThread();
  std::pair<QPointer<QThread>,_std::function<void_()>_>::
  pair<QThread_*,_std::function<void_()>,_true>(&local_50,&local_58,handler);
  QList<std::pair<QPointer<QThread>,_std::function<void_()>_>_>::append
            ((QList<std::pair<QPointer<QThread>,_std::function<void_()>_>_> *)&this->m_handlers,
             &local_50);
  std::pair<QPointer<QThread>,_std::function<void_()>_>::~pair(&local_50);
  QWriteLocker::~QWriteLocker(&local_20);
  return;
}

Assistant:

void addHandler(std::function<F> handler)
    {
        QWriteLocker lock{&m_lock};
        m_handlers.append({QThread::currentThread(), std::move(handler)});
    }